

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_client_unpause(Curl_easy *data)

{
  size_t sVar1;
  size_t sVar2;
  char *optr;
  size_t olen;
  tempbuf writebuf [3];
  uint local_18;
  uint count;
  uint i;
  CURLcode result;
  Curl_easy *data_local;
  
  count = 0;
  if ((data->state).tempcount != 0) {
    writebuf[2]._36_4_ = (data->state).tempcount;
    for (local_18 = 0; local_18 < (data->state).tempcount; local_18 = local_18 + 1) {
      memcpy(&writebuf[(ulong)local_18 - 1].type,(data->state).tempwrite + local_18,0x28);
      Curl_dyn_init(&(data->state).tempwrite[local_18].b,0x4000000);
    }
    (data->state).tempcount = 0;
    for (local_18 = 0; local_18 < (uint)writebuf[2]._36_4_; local_18 = local_18 + 1) {
      if (count == 0) {
        sVar1 = writebuf[local_18].b.toobig;
        sVar2 = writebuf[local_18].b.toobig;
        optr = Curl_dyn_ptr((dynbuf *)&writebuf[(ulong)local_18 - 1].type);
        olen = Curl_dyn_len((dynbuf *)&writebuf[(ulong)local_18 - 1].type);
        count = chop_write(data,(int)sVar1,(_Bool)(((sVar2 & 0x100000000) != 0 ^ 0xffU) & 1),optr,
                           olen);
      }
      Curl_dyn_free((dynbuf *)&writebuf[(ulong)local_18 - 1].type);
    }
  }
  return count;
}

Assistant:

CURLcode Curl_client_unpause(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;

  if(data->state.tempcount) {
    /* there are buffers for sending that can be delivered as the receive
       pausing is lifted! */
    unsigned int i;
    unsigned int count = data->state.tempcount;
    struct tempbuf writebuf[3]; /* there can only be three */

    /* copy the structs to allow for immediate re-pausing */
    for(i = 0; i < data->state.tempcount; i++) {
      writebuf[i] = data->state.tempwrite[i];
      Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
    }
    data->state.tempcount = 0;

    for(i = 0; i < count; i++) {
      /* even if one function returns error, this loops through and frees
         all buffers */
      if(!result)
        result = chop_write(data, writebuf[i].type,
                            !writebuf[i].paused_body,
                            Curl_dyn_ptr(&writebuf[i].b),
                            Curl_dyn_len(&writebuf[i].b));
      Curl_dyn_free(&writebuf[i].b);
    }
  }
  return result;
}